

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

value * json::parse(string *input)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  size_type sVar4;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  Pig n;
  value *root;
  string *input_local;
  
  n._saved = 0;
  Pig::Pig((Pig *)local_38,input);
  Pig::skipWS((Pig *)local_38);
  iVar2 = Pig::peek((Pig *)local_38);
  if (iVar2 == 0x7b) {
    n._saved = (size_type)object::parse((Pig *)local_38);
  }
  else {
    iVar2 = Pig::peek((Pig *)local_38);
    if (iVar2 != 0x5b) {
      local_6a = 1;
      psVar3 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Error: expected \'{\' or \'[\' at position {1}",&local_69);
      sVar4 = Pig::cursor((Pig *)local_38);
      format<int>(psVar3,&local_68,(int)sVar4);
      local_6a = 0;
      __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    n._saved = (size_type)array::parse((Pig *)local_38);
  }
  Pig::skipWS((Pig *)local_38);
  bVar1 = Pig::eos((Pig *)local_38);
  sVar4 = n._saved;
  if (!bVar1) {
    if (n._saved != 0) {
      (**(code **)(*(long *)n._saved + 8))();
    }
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Error: extra characters found at position {1}",&local_91);
    sVar4 = Pig::cursor((Pig *)local_38);
    format<int>(psVar3,&local_90,(int)sVar4);
    __cxa_throw(psVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Pig::~Pig((Pig *)local_38);
  return (value *)sVar4;
}

Assistant:

json::value* json::parse (const std::string& input)
{
  json::value* root = nullptr;

  Pig n (input);
  n.skipWS ();

       if (n.peek () == '{') root = json::object::parse (n);
  else if (n.peek () == '[') root = json::array::parse (n);
  else
    throw format ("Error: expected '{' or '[' at position {1}", (int) n.cursor ());

  // Check for end condition.
  n.skipWS ();
  if (!n.eos ())
  {
    delete root;
    throw format ("Error: extra characters found at position {1}", (int) n.cursor ());
  }

  return root;
}